

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

cmServerResponse * __thiscall
cmServerProtocol1::ProcessFileSystemWatchers
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  cmFileMonitor *this_00;
  Value *pVVar1;
  ValueHolder value;
  pointer value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ValueHolder local_120;
  string *local_118;
  Value directories;
  Value result;
  Value files;
  Value local_80;
  Value local_58;
  
  this_00 = cmServerProtocol::FileMonitor(&this->super_cmServerProtocol);
  Json::Value::Value(&result,objectValue);
  Json::Value::Value(&files,arrayValue);
  cmFileMonitor::WatchedFiles_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_120,this_00);
  for (value = local_120; value != local_118;
      value.string_ = (char *)&((value.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right
      ) {
    Json::Value::Value(&directories,(string *)value.map_);
    Json::Value::append(&files,&directories);
    Json::Value::~Value(&directories);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_120);
  Json::Value::Value(&directories,arrayValue);
  cmFileMonitor::WatchedDirectories_abi_cxx11_(&local_138,this_00);
  for (value_00 = local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      value_00 !=
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; value_00 = value_00 + 1) {
    Json::Value::Value((Value *)&local_120,value_00);
    Json::Value::append(&directories,(Value *)&local_120);
    Json::Value::~Value((Value *)&local_120);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  Json::Value::Value(&local_58,&files);
  pVVar1 = Json::Value::operator[](&result,&kWATCHED_FILES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_58);
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_80,&directories);
  pVVar1 = Json::Value::operator[](&result,&kWATCHED_DIRECTORIES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  cmServerRequest::Reply(__return_storage_ptr__,request,&result);
  Json::Value::~Value(&directories);
  Json::Value::~Value(&files);
  Json::Value::~Value(&result);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessFileSystemWatchers(
  const cmServerRequest& request)
{
  const cmFileMonitor* const fm = FileMonitor();
  Json::Value result = Json::objectValue;
  Json::Value files = Json::arrayValue;
  for (const auto& f : fm->WatchedFiles()) {
    files.append(f);
  }
  Json::Value directories = Json::arrayValue;
  for (const auto& d : fm->WatchedDirectories()) {
    directories.append(d);
  }
  result[kWATCHED_FILES_KEY] = files;
  result[kWATCHED_DIRECTORIES_KEY] = directories;

  return request.Reply(result);
}